

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# d3d9.cpp
# Opt level: O2

void rw::d3d9::defaultInstanceCB(Geometry *geo,InstanceDataHeader *header,bool32 reinstance)

{
  uint uVar1;
  int iVar2;
  VertexElement *pVVar3;
  ushort uVar4;
  uint32 uVar5;
  void *pvVar6;
  uint8 *puVar7;
  uint8 *puVar8;
  long lVar9;
  int iVar10;
  long lVar11;
  uint32 *puVar12;
  uint32 uVar13;
  uint uVar14;
  int iVar15;
  ulong uVar16;
  bool bVar17;
  VertexElement dcl [12];
  
  uVar1 = geo->flags;
  if (reinstance == 0) {
    header->vertexStream[0].offset = 0;
    header->vertexStream[0].managed = '\x01';
    header->vertexStream[0].dynamicLock = '\0';
    dcl[0].stream = 0;
    dcl[0].offset = 0;
    dcl[0].type = '\x02';
    dcl[0].method = '\0';
    dcl[0].usage = '\0';
    dcl[0].usageIndex = '\0';
    header->vertexStream[0].geometryFlags = 2;
    if ((uVar1 & 8) == 0) {
      lVar11 = 1;
      uVar4 = 0xc;
      uVar14 = 2;
    }
    else {
      dcl[1].stream = 0;
      dcl[1].offset = 0xc;
      dcl[1].type = '\x04';
      dcl[1].method = '\0';
      dcl[1].usage = '\n';
      dcl[1].usageIndex = '\0';
      header->vertexStream[0].geometryFlags = 10;
      lVar11 = 2;
      uVar4 = 0x10;
      uVar14 = 10;
    }
    iVar2 = geo->numTexCoordSets;
    lVar9 = 0;
    iVar15 = 0;
    if (0 < iVar2) {
      iVar15 = iVar2;
    }
    for (; iVar10 = (int)lVar9, iVar15 != iVar10; lVar9 = lVar9 + 1) {
      dcl[lVar11 + lVar9].stream = 0;
      dcl[lVar11 + lVar9].offset = uVar4;
      dcl[lVar11 + lVar9].type = '\x01';
      dcl[lVar11 + lVar9].method = '\0';
      dcl[lVar11 + lVar9].usage = '\x05';
      dcl[lVar11 + lVar9].usageIndex = (byte)lVar9;
      uVar14 = uVar14 | 0x10 << ((byte)lVar9 & 0x1f);
      header->vertexStream[0].geometryFlags = (uint16)uVar14;
      uVar4 = uVar4 + 8;
    }
    if ((uVar1 & 0x10) == 0) {
      iVar10 = (int)lVar11 + iVar10;
    }
    else {
      dcl[lVar11 + lVar9].stream = 0;
      dcl[lVar11 + lVar9].offset = uVar4;
      pVVar3 = dcl + lVar11 + lVar9;
      pVVar3->type = '\x02';
      pVVar3->method = '\0';
      pVVar3->usage = '\x03';
      pVVar3->usageIndex = '\0';
      iVar10 = (int)lVar11 + iVar10 + 1;
      header->vertexStream[0].geometryFlags = (ushort)uVar14 | 4;
      uVar4 = uVar4 + 0xc;
    }
    if ((uVar1 & 8) == 0) {
      pVVar3 = dcl + iVar10;
      pVVar3->stream = 2;
      pVVar3->offset = 0xc;
      pVVar3->type = '\x04';
      pVVar3->method = '\0';
      pVVar3->usage = '\n';
      pVVar3->usageIndex = '\0';
      iVar10 = iVar10 + 1;
    }
    if (iVar2 == 0) {
      pVVar3 = dcl + iVar10;
      pVVar3->stream = 2;
      pVVar3->offset = 0x10;
      pVVar3->type = '\x01';
      pVVar3->method = '\0';
      pVVar3->usage = '\x05';
      pVVar3->usageIndex = '\0';
      iVar10 = iVar10 + 1;
    }
    pVVar3 = dcl + iVar10;
    pVVar3->stream = 0xff;
    pVVar3->offset = 0;
    pVVar3->type = '\x11';
    pVVar3->method = '\0';
    pVVar3->usage = '\0';
    pVVar3->usageIndex = '\0';
    header->vertexStream[0].stride = (uint)uVar4;
    pvVar6 = createVertexDeclaration(dcl);
    header->vertexDeclaration = pvVar6;
    pvVar6 = d3d::createVertexBuffer
                       (header->vertexStream[0].stride * header->totalNumVertex,0,false);
    header->vertexStream[0].vertexBuffer = pvVar6;
  }
  else {
    getDeclaration(header->vertexDeclaration,dcl);
    pvVar6 = header->vertexStream[0].vertexBuffer;
  }
  puVar7 = d3d::lockVertices(pvVar6,0,0,0);
  if ((reinstance == 0) || (uVar4 = geo->lockedSinceInst, (uVar4 & 2) != 0)) {
    for (puVar8 = &dcl[0].usageIndex; (puVar8[-1] != '\0' || (*puVar8 != '\0')); puVar8 = puVar8 + 8
        ) {
    }
    instV3d(*(int *)(d3d::vertFormatMap + (ulong)puVar8[-3] * 4),puVar7 + *(ushort *)(puVar8 + -5),
            geo->morphTargets->vertices,header->totalNumVertex,
            header->vertexStream[((VertexElement *)(puVar8 + -7))->stream].stride);
    if ((uVar1 & 8) == 0) goto LAB_00111f65;
    if (reinstance != 0) {
      uVar4 = geo->lockedSinceInst;
      goto LAB_00111f5d;
    }
  }
  else {
    if ((uVar1 & 8) == 0) goto LAB_00111f65;
LAB_00111f5d:
    if ((uVar4 & 8) == 0) goto LAB_00111f65;
  }
  for (puVar8 = &dcl[0].usageIndex; (puVar8[-1] != '\n' || (*puVar8 != '\0')); puVar8 = puVar8 + 8)
  {
  }
  uVar13 = header->numMeshes;
  puVar12 = &header->inst->numVertices;
  while (bVar17 = uVar13 != 0, uVar13 = uVar13 - 1, bVar17) {
    uVar5 = header->vertexStream[((VertexElement *)(puVar8 + -7))->stream].stride;
    uVar5 = instColor(*(int *)(d3d::vertFormatMap + (ulong)puVar8[-3] * 4),
                      puVar7 + (ulong)(puVar12[-8] * uVar5) + (ulong)*(ushort *)(puVar8 + -5),
                      geo->colors + puVar12[-8],*puVar12,uVar5);
    puVar12[-5] = uVar5;
    puVar12 = puVar12 + 0xc;
  }
LAB_00111f65:
  for (uVar16 = 0; (long)uVar16 < (long)geo->numTexCoordSets; uVar16 = uVar16 + 1) {
    puVar8 = &dcl[0].usageIndex;
    if ((reinstance == 0) || ((geo->lockedSinceInst >> ((byte)uVar16 & 0x1f) & 0x10) != 0)) {
      for (; (puVar8[-1] != 5 || (uVar16 != *puVar8)); puVar8 = puVar8 + 8) {
      }
      instTexCoords(*(int *)(d3d::vertFormatMap + (ulong)puVar8[-3] * 4),
                    puVar7 + *(ushort *)(puVar8 + -5),geo->texCoords[uVar16],header->totalNumVertex,
                    header->vertexStream[((VertexElement *)(puVar8 + -7))->stream].stride);
    }
  }
  if (((uVar1 & 0x10) != 0) && ((reinstance == 0 || ((geo->lockedSinceInst & 4) != 0)))) {
    for (puVar8 = &dcl[0].usageIndex; (puVar8[-1] != '\x03' || (*puVar8 != '\0'));
        puVar8 = puVar8 + 8) {
    }
    instV3d(*(int *)(d3d::vertFormatMap + (ulong)puVar8[-3] * 4),puVar7 + *(ushort *)(puVar8 + -5),
            geo->morphTargets->normals,header->totalNumVertex,
            header->vertexStream[((VertexElement *)(puVar8 + -7))->stream].stride);
  }
  d3d::unlockVertices(header->vertexStream[0].vertexBuffer);
  return;
}

Assistant:

void
defaultInstanceCB(Geometry *geo, InstanceDataHeader *header, bool32 reinstance)
{
	int i = 0;
	VertexElement dcl[NUMDECLELT];
	VertexStream *s = &header->vertexStream[0];

	bool isPrelit = (geo->flags & Geometry::PRELIT) != 0;
	bool hasNormals = (geo->flags & Geometry::NORMALS) != 0;

	// TODO: support both vertex buffers

	if(!reinstance){
		// Create declarations and buffers only the first time

		assert(s->vertexBuffer == nil);
		s->offset = 0;
		s->managed = 1;
		s->geometryFlags = 0;
		s->dynamicLock = 0;

		dcl[i].stream = 0;
		dcl[i].offset = 0;
		dcl[i].type = D3DDECLTYPE_FLOAT3;
		dcl[i].method = D3DDECLMETHOD_DEFAULT;
		dcl[i].usage = D3DDECLUSAGE_POSITION;
		dcl[i].usageIndex = 0;
		i++;
		uint16 stride = 12;
		s->geometryFlags |= 0x2;

		if(isPrelit){
			dcl[i].stream = 0;
			dcl[i].offset = stride;
			dcl[i].type = D3DDECLTYPE_D3DCOLOR;
			dcl[i].method = D3DDECLMETHOD_DEFAULT;
			dcl[i].usage = D3DDECLUSAGE_COLOR;
			dcl[i].usageIndex = 0;
			i++;
			s->geometryFlags |= 0x8;
			stride += 4;
		}

		for(int32 n = 0; n < geo->numTexCoordSets; n++){
			dcl[i].stream = 0;
			dcl[i].offset = stride;
			dcl[i].type = D3DDECLTYPE_FLOAT2;
			dcl[i].method = D3DDECLMETHOD_DEFAULT;
			dcl[i].usage = D3DDECLUSAGE_TEXCOORD;
			dcl[i].usageIndex = (uint8)n;
			i++;
			s->geometryFlags |= 0x10 << n;
			stride += 8;
		}

		if(hasNormals){
			dcl[i].stream = 0;
			dcl[i].offset = stride;
			dcl[i].type = D3DDECLTYPE_FLOAT3;
			dcl[i].method = D3DDECLMETHOD_DEFAULT;
			dcl[i].usage = D3DDECLUSAGE_NORMAL;
			dcl[i].usageIndex = 0;
			i++;
			s->geometryFlags |= 0x4;
			stride += 12;
		}

		// We expect some attributes to always be there, use the constant buffer as fallback
		if(!isPrelit){
			dcl[i].stream = 2;
			dcl[i].offset = offsetof(VertexConstantData, color);
			dcl[i].type = D3DDECLTYPE_D3DCOLOR;
			dcl[i].method = D3DDECLMETHOD_DEFAULT;
			dcl[i].usage = D3DDECLUSAGE_COLOR;
			dcl[i].usageIndex = 0;
			i++;
		}
		if(geo->numTexCoordSets == 0){
			dcl[i].stream = 2;
			dcl[i].offset = offsetof(VertexConstantData, texCoors[0]);
			dcl[i].type = D3DDECLTYPE_FLOAT2;
			dcl[i].method = D3DDECLMETHOD_DEFAULT;
			dcl[i].usage = D3DDECLUSAGE_TEXCOORD;
			dcl[i].usageIndex = 0;
			i++;
		}

		dcl[i] = D3DDECL_END();
		s->stride = stride;

		assert(header->vertexDeclaration == nil);
		header->vertexDeclaration = createVertexDeclaration((VertexElement*)dcl);

		assert(s->vertexBuffer == nil);
		s->vertexBuffer = createVertexBuffer(header->totalNumVertex*s->stride, 0, false);
	}else
		getDeclaration(header->vertexDeclaration, dcl);

	uint8 *verts = lockVertices(s->vertexBuffer, 0, 0, D3DLOCK_NOSYSLOCK);

	// Instance vertices
	if(!reinstance || geo->lockedSinceInst&Geometry::LOCKVERTICES){
		for(i = 0; dcl[i].usage != D3DDECLUSAGE_POSITION || dcl[i].usageIndex != 0; i++)
			;
		instV3d(vertFormatMap[dcl[i].type], verts + dcl[i].offset,
			geo->morphTargets[0].vertices,
			header->totalNumVertex,
			header->vertexStream[dcl[i].stream].stride);
	}

	// Instance prelight colors
	if(isPrelit && (!reinstance || geo->lockedSinceInst&Geometry::LOCKPRELIGHT)){
		for(i = 0; dcl[i].usage != D3DDECLUSAGE_COLOR || dcl[i].usageIndex != 0; i++)
			;
		InstanceData *inst = header->inst;
		uint32 n = header->numMeshes;
		while(n--){
			uint32 stride = header->vertexStream[dcl[i].stream].stride;
			inst->vertexAlpha = instColor(vertFormatMap[dcl[i].type],
				verts + dcl[i].offset + stride*inst->minVert,
				geo->colors + inst->minVert,
				inst->numVertices,
				stride);
			inst++;
		}
	}

	// Instance tex coords
	for(int32 n = 0; n < geo->numTexCoordSets; n++){
		if(!reinstance || geo->lockedSinceInst&(Geometry::LOCKTEXCOORDS<<n)){
			for(i = 0; dcl[i].usage != D3DDECLUSAGE_TEXCOORD || dcl[i].usageIndex != n; i++)
				;
			instTexCoords(vertFormatMap[dcl[i].type], verts + dcl[i].offset,
				geo->texCoords[n],
				header->totalNumVertex,
				header->vertexStream[dcl[i].stream].stride);
		}
	}

	// Instance normals
	if(hasNormals && (!reinstance || geo->lockedSinceInst&Geometry::LOCKNORMALS)){
		for(i = 0; dcl[i].usage != D3DDECLUSAGE_NORMAL || dcl[i].usageIndex != 0; i++)
			;
		instV3d(vertFormatMap[dcl[i].type], verts + dcl[i].offset,
			geo->morphTargets[0].normals,
			header->totalNumVertex,
			header->vertexStream[dcl[i].stream].stride);
	}
	unlockVertices(s->vertexBuffer);
}